

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void Memory::Recycler::WBSetBitRange(char *addr,uint count)

{
  HeapBlock *pHVar1;
  HeapBlock *heapBlock;
  Recycler *recycler;
  AutoCriticalSection lock;
  uint count_local;
  char *addr_local;
  
  if (((Js::Configuration::Global[0x2c156] & 1) != 0) &&
     ((Js::Configuration::Global[0x2c157] & 1) != 0)) {
    lock.cs._4_4_ = count;
    AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&recycler,&recyclerListLock);
    for (heapBlock = (HeapBlock *)recyclerList; heapBlock != (HeapBlock *)0x0;
        heapBlock = *(HeapBlock **)&heapBlock[0xb36].heapBlockType) {
      pHVar1 = FindHeapBlock((Recycler *)heapBlock,(void *)((ulong)addr & 0xfffffffffffffff0));
      if (pHVar1 != (HeapBlock *)0x0) {
        (*pHVar1->_vptr_HeapBlock[1])(pHVar1,addr,(ulong)lock.cs._4_4_);
        break;
      }
    }
    AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&recycler);
  }
  return;
}

Assistant:

void
Recycler::WBSetBitRange(char* addr, uint count)
{
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        AutoCriticalSection lock(&recyclerListLock);
        Recycler* recycler = Recycler::recyclerList;
        while (recycler)
        {
            auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
            if (heapBlock)
            {
                heapBlock->WBSetBitRange(addr, count);
                break;
            }
            recycler = recycler->next;
        }
    }
}